

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join.c
# Opt level: O1

int run_test_udp_multicast_join(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_udp_send_t *loop;
  uv_loop_t *loop_00;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 unaff_RBX;
  int iVar2;
  code *addr_00;
  uv_udp_t *puVar3;
  char *pcVar4;
  uv_udp_send_t *puVar5;
  uv_udp_send_t *req;
  int in_R8D;
  bool bVar6;
  sockaddr_in addr;
  uv_buf_t uStack_a0;
  sockaddr_in sStack_90;
  code *pcStack_80;
  char acStack_78 [64];
  code *pcStack_38;
  code *pcStack_30;
  
  pcVar4 = "0.0.0.0";
  addr_00 = (code *)0x23a3;
  pcStack_30 = (code *)0x186185;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&stack0xffffffffffffffe0);
  if (iVar1 == 0) {
    pcStack_30 = (code *)0x186192;
    loop = (uv_udp_send_t *)uv_default_loop();
    puVar3 = &server;
    pcStack_30 = (code *)0x1861a1;
    iVar1 = uv_udp_init((uv_loop_t *)loop,&server);
    addr_00 = (code *)puVar3;
    if (iVar1 != 0) goto LAB_001862f0;
    pcStack_30 = (code *)0x1861ae;
    loop = (uv_udp_send_t *)uv_default_loop();
    puVar3 = &client;
    pcStack_30 = (code *)0x1861bd;
    iVar1 = uv_udp_init((uv_loop_t *)loop,&client);
    addr_00 = (code *)puVar3;
    if (iVar1 != 0) goto LAB_001862f5;
    puVar3 = &server;
    addr_00 = (code *)&stack0xffffffffffffffe0;
    pcStack_30 = (code *)0x1861d8;
    iVar1 = uv_udp_bind(&server,(sockaddr *)addr_00,0);
    loop = (uv_udp_send_t *)puVar3;
    if (iVar1 != 0) goto LAB_001862fa;
    puVar3 = &server;
    pcVar4 = "239.255.0.1";
    pcStack_30 = (code *)0x1861fa;
    iVar1 = uv_udp_set_membership(&server,"239.255.0.1",(char *)0x0,UV_JOIN_GROUP);
    if (iVar1 != 0) {
      addr_00 = (code *)pcVar4;
      loop = (uv_udp_send_t *)puVar3;
      if (iVar1 == -0x13) {
        pcStack_30 = (code *)0x1862e4;
        run_test_udp_multicast_join_cold_14();
        return 1;
      }
      goto LAB_001862ff;
    }
    puVar3 = &server;
    addr_00 = alloc_cb;
    pcStack_30 = (code *)0x18621c;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,cl_recv_cb);
    loop = (uv_udp_send_t *)puVar3;
    if (iVar1 != 0) goto LAB_00186304;
    loop = &::req;
    pcStack_30 = (code *)0x186230;
    iVar1 = do_send(&::req);
    if (iVar1 != 0) goto LAB_00186309;
    if (close_cb_called != 0) goto LAB_0018630e;
    if (cl_recv_cb_called != 0) goto LAB_00186313;
    if (sv_send_cb_called != 0) goto LAB_00186318;
    pcStack_30 = (code *)0x186264;
    loop = (uv_udp_send_t *)uv_default_loop();
    addr_00 = (code *)0x0;
    pcStack_30 = (code *)0x18626e;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (cl_recv_cb_called != 2) goto LAB_0018631d;
    if (sv_send_cb_called != 2) goto LAB_00186322;
    if (close_cb_called != 2) goto LAB_00186327;
    pcStack_30 = (code *)0x18629a;
    loop_00 = uv_default_loop();
    unaff_RBX = 0;
    pcStack_30 = (code *)0x1862b0;
    uv_walk(loop_00,close_walk_cb,(void *)0x0);
    addr_00 = (code *)0x0;
    pcStack_30 = (code *)0x1862ba;
    uv_run(loop_00,UV_RUN_DEFAULT);
    pcStack_30 = (code *)0x1862bf;
    loop = (uv_udp_send_t *)uv_default_loop();
    pcStack_30 = (code *)0x1862c7;
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      pcStack_30 = (code *)0x1862d0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_30 = (code *)0x1862f0;
    run_test_udp_multicast_join_cold_1();
    loop = (uv_udp_send_t *)pcVar4;
LAB_001862f0:
    pcStack_30 = (code *)0x1862f5;
    run_test_udp_multicast_join_cold_2();
LAB_001862f5:
    pcStack_30 = (code *)0x1862fa;
    run_test_udp_multicast_join_cold_3();
LAB_001862fa:
    pcStack_30 = (code *)0x1862ff;
    run_test_udp_multicast_join_cold_4();
LAB_001862ff:
    pcStack_30 = (code *)0x186304;
    run_test_udp_multicast_join_cold_15();
LAB_00186304:
    pcStack_30 = (code *)0x186309;
    run_test_udp_multicast_join_cold_5();
LAB_00186309:
    pcStack_30 = (code *)0x18630e;
    run_test_udp_multicast_join_cold_6();
LAB_0018630e:
    pcStack_30 = (code *)0x186313;
    run_test_udp_multicast_join_cold_7();
LAB_00186313:
    pcStack_30 = (code *)0x186318;
    run_test_udp_multicast_join_cold_8();
LAB_00186318:
    pcStack_30 = (code *)0x18631d;
    run_test_udp_multicast_join_cold_9();
LAB_0018631d:
    pcStack_30 = (code *)0x186322;
    run_test_udp_multicast_join_cold_10();
LAB_00186322:
    pcStack_30 = (code *)0x186327;
    run_test_udp_multicast_join_cold_11();
LAB_00186327:
    pcStack_30 = (code *)0x18632c;
    run_test_udp_multicast_join_cold_12();
  }
  pcStack_30 = alloc_cb;
  run_test_udp_multicast_join_cold_13();
  req = (uv_udp_send_t *)
        CONCAT71(0x578e,loop == (uv_udp_send_t *)&client || loop == (uv_udp_send_t *)&server);
  if (loop == (uv_udp_send_t *)&client || loop == (uv_udp_send_t *)&server) {
    if (addr_00 < (uv_udp_t *)0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return extraout_EAX;
    }
  }
  else {
    pcStack_38 = (code *)0x186372;
    alloc_cb_cold_1();
  }
  pcStack_38 = cl_recv_cb;
  alloc_cb_cold_2();
  bVar6 = loop == (uv_udp_send_t *)&server;
  puVar5 = (uv_udp_send_t *)
           CONCAT71((int7)((ulong)loop >> 8),loop == (uv_udp_send_t *)&client || bVar6);
  if (loop == (uv_udp_send_t *)&client || bVar6) {
    if (in_R8D != 0) goto LAB_00186477;
    if ((long)addr_00 < 0) goto LAB_0018647c;
    if ((uv_udp_t *)addr_00 != (uv_udp_t *)0x0) {
      if (req == (uv_udp_send_t *)0x0) goto LAB_00186481;
      if ((uv_udp_t *)addr_00 != (uv_udp_t *)0x4) goto LAB_00186486;
      if (*(int *)*extraout_RDX_00 == 0x474e4950) {
        cl_recv_cb_called = cl_recv_cb_called + 1;
        if (cl_recv_cb_called == 2) {
          uv_close((uv_handle_t *)&server,close_cb);
          return extraout_EAX_00;
        }
        goto LAB_0018640c;
      }
      goto LAB_0018648b;
    }
    if (req == (uv_udp_send_t *)0x0) {
      return (int)CONCAT71(0x578d,bVar6);
    }
    pcStack_80 = (code *)0x18640c;
    cl_recv_cb_cold_10();
LAB_0018640c:
    pcStack_80 = (code *)0x18641c;
    iVar1 = uv_ip4_name((sockaddr_in *)req,acStack_78,0x40);
    if (iVar1 != 0) goto LAB_00186490;
    puVar3 = &server;
    pcStack_80 = (code *)0x186437;
    iVar1 = uv_udp_set_membership(&server,"239.255.0.1",(char *)0x0,UV_LEAVE_GROUP);
    req = (uv_udp_send_t *)puVar3;
    if (iVar1 != 0) goto LAB_00186495;
    puVar3 = &server;
    pcStack_80 = (code *)0x186459;
    iVar1 = uv_udp_set_source_membership(&server,"239.255.0.1",(char *)0x0,acStack_78,UV_JOIN_GROUP)
    ;
    req = (uv_udp_send_t *)puVar3;
    if (iVar1 != 0) goto LAB_0018649a;
    req = &req_ss;
    pcStack_80 = (code *)0x186469;
    iVar1 = do_send(&req_ss);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_80 = (code *)0x186477;
    cl_recv_cb_cold_1();
LAB_00186477:
    pcStack_80 = (code *)0x18647c;
    cl_recv_cb_cold_2();
LAB_0018647c:
    pcStack_80 = (code *)0x186481;
    cl_recv_cb_cold_11();
LAB_00186481:
    pcStack_80 = (code *)0x186486;
    cl_recv_cb_cold_9();
LAB_00186486:
    pcStack_80 = (code *)0x18648b;
    cl_recv_cb_cold_3();
LAB_0018648b:
    req = puVar5;
    pcStack_80 = (code *)0x186490;
    cl_recv_cb_cold_4();
LAB_00186490:
    pcStack_80 = (code *)0x186495;
    cl_recv_cb_cold_5();
LAB_00186495:
    pcStack_80 = (code *)0x18649a;
    cl_recv_cb_cold_6();
LAB_0018649a:
    pcStack_80 = (code *)0x18649f;
    cl_recv_cb_cold_7();
  }
  pcStack_80 = do_send;
  cl_recv_cb_cold_8();
  pcStack_80 = (code *)unaff_RBX;
  uStack_a0 = uv_buf_init("PING",4);
  pcVar4 = "239.255.0.1";
  iVar2 = 0x23a3;
  iVar1 = uv_ip4_addr("239.255.0.1",0x23a3,&sStack_90);
  if (iVar1 == 0) {
    iVar1 = uv_udp_send(req,&client,&uStack_a0,1,(sockaddr *)&sStack_90,sv_send_cb);
    return iVar1;
  }
  do_send_cold_1();
  if ((uv_udp_t *)pcVar4 == &client || (uv_udp_t *)pcVar4 == &server) {
    close_cb_called = close_cb_called + 1;
    return (int)CONCAT71(0x578d,(uv_udp_t *)pcVar4 == &server);
  }
  close_cb_cold_1();
  if ((uv_udp_t *)pcVar4 == (uv_udp_t *)0x0) {
    sv_send_cb_cold_3();
  }
  else if (iVar2 == 0) {
    pcVar4 = (char *)((anon_union_32_2_8d26fa8b_for_u *)&((uv_udp_t *)pcVar4)->u)->reserved[2];
    if ((uv_udp_t *)pcVar4 == &client || (uv_udp_t *)pcVar4 == &server) {
      sv_send_cb_called = sv_send_cb_called + 1;
      if (sv_send_cb_called != 2) {
        return extraout_EAX_01;
      }
      uv_close((uv_handle_t *)pcVar4,close_cb);
      return extraout_EAX_02;
    }
    goto LAB_00186591;
  }
  sv_send_cb_cold_1();
LAB_00186591:
  sv_send_cb_cold_2();
  iVar1 = uv_is_closing((uv_handle_t *)pcVar4);
  if (iVar1 == 0) {
    uv_close((uv_handle_t *)pcVar4,(uv_close_cb)0x0);
    return extraout_EAX_03;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_multicast_join) {
  int r;
  struct sockaddr_in addr;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  /* bind to the desired port */
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  /* join the multicast channel */
  r = uv_udp_set_membership(&server, MULTICAST_ADDR, NULL, UV_JOIN_GROUP);
  if (r == UV_ENODEV)
    RETURN_SKIP("No multicast support.");
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, cl_recv_cb);
  ASSERT(r == 0);

  r = do_send(&req);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_recv_cb_called == 2);
  ASSERT(sv_send_cb_called == 2);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}